

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestOneof2_NestedMessage::_InternalSerialize
          (TestOneof2_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint32_t *puVar4;
  int64_t value;
  RepeatedField<int> *this_00;
  LogMessage *pLVar5;
  const_pointer piVar6;
  UnknownFieldSet *unknown_fields;
  const_pointer piVar7;
  int byte_size;
  uint32_t cached_has_bits;
  TestOneof2_NestedMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestOneof2_NestedMessage *this_local;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_b0;
  byte *local_88;
  ulong local_80;
  LogMessage local_58;
  Voidify local_41;
  byte *local_40;
  undefined4 local_38;
  undefined4 local_34;
  EpsCopyOutputStream *local_30;
  byte *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  stream_local = (EpsCopyOutputStream *)target;
  if ((*puVar4 & 1) != 0) {
    value = _internal_moo_int(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>
                             (stream,value,target);
  }
  uVar2 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._corge_int_cached_byte_size_);
  if (0 < (int)uVar2) {
    this_00 = _internal_corge_int(this);
    local_40 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                         (stream,(uint8_t *)stream_local);
    local_34 = 2;
    local_38 = 2;
    local_30 = stream;
    if (stream->end_ <= local_40) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    local_1c = 0x12;
    local_28 = local_40;
    while (0x7f < local_1c) {
      *local_28 = (byte)local_1c | 0x80;
      local_28 = local_28 + 1;
      local_1c = 0;
    }
    *local_28 = (byte)local_1c;
    local_18 = (EpsCopyOutputStream *)(local_28 + 1);
    for (local_c = uVar2; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_b0 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_28 = local_28 + 1;
    local_18 = local_b0;
    piVar6 = google::protobuf::RepeatedField<int>::data(this_00);
    iVar3 = google::protobuf::RepeatedField<int>::size(this_00);
    end = piVar6;
    do {
      local_88 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_b0);
      piVar7 = end + 1;
      for (local_80 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end);
          0x7f < local_80; local_80 = local_80 >> 7) {
        *local_88 = (byte)local_80 | 0x80;
        local_88 = local_88 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_88 + 1);
      *local_88 = (byte)local_80;
      end = piVar7;
      local_b0 = stream_local;
    } while (piVar7 < piVar6 + iVar3);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestOneof2_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestOneof2_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestOneof2.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int64 moo_int = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>(
            stream, this_._internal_moo_int(), target);
  }

  // repeated int32 corge_int = 2;
  {
    int byte_size = this_._impl_._corge_int_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_corge_int(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestOneof2.NestedMessage)
  return target;
}